

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

string * __thiscall
OpenMD::StringTokenizer::nextToken_abi_cxx11_(string *__return_storage_ptr__,StringTokenizer *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  paVar5 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->currentPos_)._M_current != (this->end_)._M_current) {
    pcVar3 = (this->currentPos_)._M_current;
    if (pcVar3 != (this->end_)._M_current) {
      do {
        lVar2 = std::__cxx11::string::find((char)this + ' ',(ulong)(uint)(int)*pcVar3);
        if (lVar2 == -1) break;
        bVar1 = this->returnTokens_;
        pcVar3 = (this->currentPos_)._M_current + 1;
        (this->currentPos_)._M_current = pcVar3;
        if (bVar1 == true) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,
                     (long)paVar5 - (long)(__return_storage_ptr__->_M_dataplus)._M_p,0,'\x01');
          return __return_storage_ptr__;
        }
      } while (pcVar3 != (this->end_)._M_current);
    }
    pcVar3 = (this->currentPos_)._M_current;
    if (pcVar3 != (this->end_)._M_current) {
      do {
        lVar2 = std::__cxx11::string::find((char)this + ' ',(ulong)(uint)(int)*pcVar3);
        if (lVar2 != -1) {
          return __return_storage_ptr__;
        }
        (this->currentPos_)._M_current = (this->currentPos_)._M_current + 1;
        uVar4 = (long)paVar5 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
        std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,uVar4,0,'\x01');
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((__return_storage_ptr__->_M_dataplus)._M_p + uVar4 + 1);
        pcVar3 = (this->currentPos_)._M_current;
      } while (pcVar3 != (this->end_)._M_current);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringTokenizer::nextToken() {
    std::string result;

    if (currentPos_ != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (currentPos_ != end_ && isDelimiter(*currentPos_)) {
        if (returnTokens_) {
          *insertIter++ = *currentPos_++;
          return result;
        }

        ++currentPos_;
      }

      while (currentPos_ != end_ && !isDelimiter(*currentPos_)) {
        *insertIter++ = *currentPos_++;
      }
    }

    return result;
  }